

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

void __thiscall
nvim::Nvim::buf_set_lines
          (Nvim *this,Buffer buffer,Integer start,Integer end,bool strict_indexing,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *replacement)

{
  allocator local_59;
  string local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *replacement_local;
  Integer IStack_28;
  bool strict_indexing_local;
  Integer end_local;
  Integer start_local;
  Buffer buffer_local;
  Nvim *this_local;
  
  local_38 = replacement;
  replacement_local._7_1_ = strict_indexing;
  IStack_28 = end;
  end_local = start;
  start_local = buffer;
  buffer_local = (Buffer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"nvim_buf_set_lines",&local_59);
  NvimRPC::
  call<long,long,long,bool,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&this->client_,&local_58,(nullptr_t)0x0,&start_local,&end_local,
             &stack0xffffffffffffffd8,(bool *)((long)&replacement_local + 7),local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return;
}

Assistant:

void Nvim::buf_set_lines(Buffer buffer, Integer start, Integer end, bool strict_indexing, const std::vector<std::string>& replacement) {
    client_.call("nvim_buf_set_lines", nullptr, buffer, start, end, strict_indexing, replacement);
}